

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::RegisteredHitCounters::validateEveryN
          (RegisteredHitCounters *this,char *filename,LineNumber lineNumber,size_t n)

{
  HitCounter *this_00;
  size_t sVar1;
  size_t in_RCX;
  LineNumber in_RDX;
  char *in_RSI;
  long *in_RDI;
  bool result;
  HitCounter *counter;
  ScopedLock scopedLock;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  NoScopedLock<el::base::threading::internal::NoMutex> *in_stack_ffffffffffffff90;
  bool local_59;
  unsigned_long in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd0;
  NoScopedLock<el::base::threading::internal::NoMutex> in_stack_ffffffffffffffd8;
  
  (**(code **)(*in_RDI + 0x10))();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            (in_stack_ffffffffffffff90,
             (NoMutex *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  this_00 = utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
            get<char_const*,unsigned_long>
                      ((RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *)
                       in_stack_ffffffffffffffd8._vptr_NoScopedLock,in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8);
  if (this_00 == (HitCounter *)0x0) {
    this_00 = (HitCounter *)operator_new(0x20);
    HitCounter::HitCounter(this_00,in_RSI,in_RDX);
    (**(code **)(*in_RDI + 0x80))();
  }
  HitCounter::validateHitCounts(this_00,in_RCX);
  local_59 = false;
  if (in_RCX != 0) {
    sVar1 = HitCounter::hitCounts(this_00);
    local_59 = false;
    if (sVar1 != 0) {
      sVar1 = HitCounter::hitCounts(this_00);
      local_59 = sVar1 % in_RCX == 0;
    }
  }
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&stack0xffffffffffffffd8);
  return (bool)(local_59 & 1);
}

Assistant:

bool RegisteredHitCounters::validateEveryN(const char* filename, base::type::LineNumber lineNumber, std::size_t n) {
  base::threading::ScopedLock scopedLock(lock());
  base::HitCounter* counter = get(filename, lineNumber);
  if (counter == nullptr) {
    registerNew(counter = new base::HitCounter(filename, lineNumber));
  }
  counter->validateHitCounts(n);
  bool result = (n >= 1 && counter->hitCounts() != 0 && counter->hitCounts() % n == 0);
  return result;
}